

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  if (ptr == end) {
    return -1;
  }
  bVar1 = *ptr;
  iVar5 = 0;
  pbVar4 = (byte *)ptr;
  if (bVar1 - 0xd8 < 4) {
LAB_0048c389:
    lVar7 = (long)end - (long)ptr;
joined_r0x0048c390:
    iVar6 = iVar5;
    if (lVar7 < 4) {
      return -2;
    }
  }
  else {
    iVar6 = 0;
    if (bVar1 - 0xdc < 4) goto switchD_0048c333_caseD_8;
    if (bVar1 == 0) {
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      if (cVar2 == '\x05') {
        lVar7 = (long)end - (long)ptr;
joined_r0x0048c3bc:
        iVar6 = iVar5;
        if (lVar7 < 2) {
          return -2;
        }
        goto switchD_0048c333_caseD_8;
      }
      if (cVar2 == '\x06') {
        lVar7 = (long)end - (long)ptr;
joined_r0x0048c3c7:
        iVar6 = iVar5;
        if (lVar7 < 3) {
          return -2;
        }
        goto switchD_0048c333_caseD_8;
      }
      if (cVar2 == '\a') goto LAB_0048c389;
      if (cVar2 == '\x13') {
        pbVar4 = (byte *)(ptr + 2);
        if (pbVar4 == (byte *)end) {
          return -1;
        }
        if (*pbVar4 == 0) {
          if ((ulong)(byte)ptr[3] == 0x78) {
            pbVar4 = (byte *)(ptr + 4);
            if (pbVar4 == (byte *)end) {
              return -1;
            }
            iVar6 = iVar5;
            if ((*pbVar4 == 0) &&
               ((*(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[5]) & 0xfe) == 0x18)) {
              pbVar4 = (byte *)(ptr + 6);
              while( true ) {
                if (pbVar4 == (byte *)end) {
                  return -1;
                }
                if (*pbVar4 != 0) goto switchD_0048c333_caseD_8;
                bVar1 = *(byte *)((long)enc[1].scanners + (ulong)pbVar4[1]);
                if (1 < bVar1 - 0x18) break;
                pbVar4 = pbVar4 + 2;
              }
              if (bVar1 == 0x12) {
                pbVar4 = pbVar4 + 2;
                iVar6 = 10;
              }
            }
          }
          else {
            iVar6 = iVar5;
            if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[3]) == '\x19') {
              pbVar3 = (byte *)(ptr + 4);
              do {
                pbVar4 = pbVar3;
                if (pbVar4 == (byte *)end) {
                  return -1;
                }
                if (*pbVar4 != 0) goto switchD_0048c333_caseD_8;
                cVar2 = *(char *)((long)enc[1].scanners + (ulong)pbVar4[1]);
                pbVar3 = pbVar4 + 2;
              } while (cVar2 == '\x19');
              if (cVar2 == '\x12') {
                pbVar4 = pbVar4 + 2;
                iVar6 = 10;
              }
            }
          }
        }
        goto switchD_0048c333_caseD_8;
      }
      if ((cVar2 == '\x16') || (cVar2 == '\x18')) goto LAB_0048c276;
      iVar6 = iVar5;
      if (cVar2 != '\x1d') goto switchD_0048c333_caseD_8;
    }
    else if ((bVar1 == 0xff) && (iVar6 = iVar5, 0xfd < (byte)ptr[1])) goto switchD_0048c333_caseD_8;
    iVar6 = iVar5;
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)ptr[1] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5))
         >> ((byte)ptr[1] & 0x1f) & 1) != 0) {
LAB_0048c276:
      lVar7 = (long)end - (long)ptr;
      pbVar3 = (byte *)(ptr + 4);
      while( true ) {
        lVar7 = lVar7 + -2;
        pbVar4 = pbVar3 + -2;
        if (pbVar4 == (byte *)end) {
          return -1;
        }
        bVar1 = *pbVar4;
        if (bVar1 == 0) break;
        if (bVar1 == 0xff) {
          iVar6 = iVar5;
          if (0xfd < pbVar3[-1]) goto switchD_0048c333_caseD_8;
        }
        else {
          if (bVar1 - 0xd8 < 4) goto switchD_0048c333_caseD_7;
          iVar6 = iVar5;
          if (bVar1 - 0xdc < 4) goto switchD_0048c333_caseD_8;
        }
switchD_0048c333_caseD_1d:
        iVar6 = iVar5;
        if ((*(uint *)((long)namingBitmap +
                      (ulong)(pbVar3[-1] >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             (pbVar3[-1] & 0x1f) & 1) == 0) goto switchD_0048c333_caseD_8;
switchD_0048c333_caseD_16:
        pbVar3 = pbVar3 + 2;
      }
      iVar6 = iVar5;
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)pbVar3[-1])) {
      case 5:
        goto joined_r0x0048c3bc;
      case 6:
        goto joined_r0x0048c3c7;
      case 7:
switchD_0048c333_caseD_7:
        goto joined_r0x0048c390;
      default:
        break;
      case 0x12:
        pbVar4 = pbVar3;
        iVar6 = 9;
        break;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_0048c333_caseD_16;
      case 0x1d:
        goto switchD_0048c333_caseD_1d;
      }
    }
  }
switchD_0048c333_caseD_8:
  *nextTokPtr = (char *)pbVar4;
  return iVar6;
}

Assistant:

static
int PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}